

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# infozip.cpp
# Opt level: O3

int64_t iz_deflate(int level,char *tgt,char *src,ulg tgtsize,ulg srcsize)

{
  uzoff_t uVar1;
  long lVar2;
  int64_t iVar3;
  int *piVar4;
  IZDeflate *pIVar5;
  int *piVar6;
  IZDeflate IStack_4b240;
  char *local_78;
  BufData buf;
  int local_38;
  ush local_34 [2];
  int method;
  ush att;
  ush flags;
  
  local_34[0] = 0xffff;
  local_34[1] = 0;
  local_38 = 8;
  piVar4 = &DAT_00194a80;
  pIVar5 = &IStack_4b240;
  for (lVar2 = 0x1d; lVar2 != 0; lVar2 = lVar2 + -1) {
    pIVar5->extra_lbits[0] = *piVar4;
    piVar4 = piVar4 + 1;
    pIVar5 = (IZDeflate *)(pIVar5->extra_lbits + 1);
  }
  piVar4 = &DAT_00194af4;
  piVar6 = IStack_4b240.extra_dbits;
  for (lVar2 = 0x1e; lVar2 != 0; lVar2 = lVar2 + -1) {
    *piVar6 = *piVar4;
    piVar4 = piVar4 + 1;
    piVar6 = piVar6 + 1;
  }
  piVar4 = &DAT_00194b6c;
  piVar6 = IStack_4b240.extra_blbits;
  for (lVar2 = 0x13; lVar2 != 0; lVar2 = lVar2 + -1) {
    *piVar6 = *piVar4;
    piVar4 = piVar4 + 1;
    piVar6 = piVar6 + 1;
  }
  IStack_4b240.l_desc.extra_bits = (int *)0x0;
  IStack_4b240.l_desc.dyn_tree = (ct_data *)0x0;
  IStack_4b240.l_desc.static_tree = (ct_data *)0x0;
  IStack_4b240.l_desc.extra_base = 0x101;
  IStack_4b240.l_desc.elems = 0x11e;
  IStack_4b240.l_desc.max_length = 0xf;
  IStack_4b240._4316_8_ = 0;
  IStack_4b240.d_desc._4_8_ = 0;
  IStack_4b240.d_desc._12_8_ = 0;
  IStack_4b240.d_desc._20_8_ = 0;
  IStack_4b240.d_desc.elems = 0x1e;
  IStack_4b240.d_desc.max_length = 0xf;
  IStack_4b240._4356_8_ = 0;
  IStack_4b240.bl_desc._4_8_ = 0;
  IStack_4b240.bl_desc._12_8_ = 0;
  IStack_4b240.bl_desc._20_8_ = 0;
  IStack_4b240.bl_desc.elems = 0x13;
  IStack_4b240.bl_desc.max_length = 7;
  IStack_4b240.bl_desc.max_code = 0;
  builtin_memcpy(IStack_4b240.bl_order,"\x10\x11\x12",4);
  builtin_memcpy(IStack_4b240.bl_order + 4,"\b\a\t\x06\n\x05\v\x04\f\x03\r\x02\x0e\x01\x0f",0xf);
  buf._24_8_ = tgtsize;
  memcpy(IStack_4b240.configuration_table,&DAT_00194bcc,0x50);
  IStack_4b240.dot_size = 0;
  IStack_4b240.dot_count = 0;
  IStack_4b240.display_globaldots = 0;
  IStack_4b240.verbose = 1;
  IStack_4b240.noisy = 1;
  IStack_4b240._307620_8_ = 0;
  IStack_4b240._307628_8_ = 0;
  IStack_4b240.mesg._4_4_ = 0;
  IStack_4b240.use_descriptors = 0;
  IStack_4b240.read_handle = &local_78;
  buf.in_buf._0_4_ = (undefined4)srcsize;
  buf.in_buf._4_4_ = 0;
  buf.zid._0_1_ = '\0';
  IStack_4b240.read_buf = mem_read;
  IStack_4b240.level = level;
  local_78 = src;
  buf._8_8_ = &IStack_4b240;
  memset(IStack_4b240.window,0,0x10000);
  IZDeflate::bi_init(&IStack_4b240,tgt,buf._24_4_,0);
  IZDeflate::ct_init(&IStack_4b240,local_34,&local_38);
  IZDeflate::lm_init(&IStack_4b240,IStack_4b240.level + (uint)(IStack_4b240.level == 0),local_34 + 1
                    );
  uVar1 = IZDeflate::deflate(&IStack_4b240);
  iVar3 = -1;
  if ((char)buf.zid == '\0') {
    if (local_38 == 0) {
      iVar3 = -2;
    }
    else {
      iVar3 = (long)IStack_4b240.last_bits + (uVar1 & 0xffffffff) * 8 + -8;
    }
  }
  return iVar3;
}

Assistant:

int64_t iz_deflate(int level, char* tgt, char* src, ulg tgtsize, ulg srcsize)
{
    ush att = (ush)UNKNOWN;
    ush flags = 0;
    unsigned long out_total = 0;
    int method = DEFLATE;

    IZDeflate zid;
    BufData buf;
    buf.in_buf = src;
    buf.in_size = (unsigned)srcsize;
    buf.in_offset = 0;
    buf.zid = &zid;
    buf.fail = false;

    zid.read_buf = mem_read;
    zid.read_handle = &buf;
    zid.window_size = 0L;
    zid.level = level;
    memset(zid.window, 0, sizeof(zid.window));

    zid.bi_init(tgt, (unsigned)(tgtsize), FALSE);
    zid.ct_init(&att, &method);
    zid.lm_init((zid.level != 0 ? zid.level : 1), &flags);
    out_total = (unsigned)zid.deflate();

    if (buf.fail)
        return -1;

    if (method == STORE)
        return -2;

    // printf("Last bits: %d\n", zid.last_bits);
    return ((out_total - 1) << 3) + zid.last_bits;
}